

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O3

int __thiscall
ssllabs::SSLlabs::analyze
          (SSLlabs *this,string *domain,string *data,bool publish,bool startNew,bool fromCache,
          bool ignoreMismatch)

{
  int iVar1;
  string local_58;
  string *local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = data;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"/analyze?host=","");
  std::__cxx11::string::_M_append((char *)&local_58,(ulong)(domain->_M_dataplus)._M_p);
  if (startNew && fromCache) {
    iVar1 = -1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"could not use startNew and fromCache at the same time\n",0x36)
    ;
  }
  else {
    if (publish) {
      std::__cxx11::string::append((char *)&local_58);
    }
    if (startNew) {
      std::__cxx11::string::append((char *)&local_58);
    }
    if (ignoreMismatch || fromCache) {
      std::__cxx11::string::append((char *)&local_58);
    }
    iVar1 = curl_read(this,&local_58,local_38);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return iVar1;
}

Assistant:

int SSLlabs::analyze(const std::string domain, const std::string &data,
                         bool publish, bool startNew, bool fromCache, bool ignoreMismatch) {
        std::string command("/analyze?host=");

        command += domain;
        if (startNew && fromCache) {
            std::cerr << "could not use startNew and fromCache at the same time\n";
            return -1;
        }

        if (publish) {
            command += "&publish=on";
        }

        if (startNew) {
            command += "&startNew=on";
        }

        if (fromCache) {
            command += "&fromCache=on";
        }
        else {
            if (ignoreMismatch) {
                command += "&ignoreMismatch=on";
            }
        }

        return curl_read(command, data);
    }